

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ReceivedServerConnect(connectdata *conn,_Bool *received)

{
  curl_socket_t readfd0;
  curl_socket_t readfd1;
  Curl_easy *data;
  char *pcVar1;
  uint uVar2;
  time_t tVar3;
  int ftpcode;
  ssize_t nread;
  
  data = conn->data;
  readfd0 = conn->sock[0];
  readfd1 = conn->sock[1];
  *received = false;
  tVar3 = ftp_timeleft_accept(data);
  Curl_infof(data,"Checking for server connect\n");
  if (tVar3 < 0) {
    Curl_failf(data,"Accept timeout occurred while waiting server connect");
    return CURLE_FTP_ACCEPT_TIMEOUT;
  }
  if ((((conn->proto).ftpc.pp.cache_size == 0) ||
      (pcVar1 = (conn->proto).ftpc.pp.cache, pcVar1 == (char *)0x0)) || (*pcVar1 < '4')) {
    uVar2 = Curl_socket_check(readfd0,readfd1,-1,0);
    if (uVar2 == 0) {
      return CURLE_OK;
    }
    if (uVar2 != 0xffffffff) {
      if ((uVar2 & 8) != 0) {
        Curl_infof(data,"Ready to accept data connection from server\n");
        *received = true;
        return CURLE_OK;
      }
      if ((uVar2 & 1) == 0) {
        return CURLE_OK;
      }
      Curl_infof(data,"Ctrl conn has data while waiting for data conn\n");
      Curl_GetFTPResponse(&nread,conn,&ftpcode);
      return (uint)(399 < ftpcode) * 2 + CURLE_WEIRD_SERVER_REPLY;
    }
    Curl_failf(data,"Error while waiting for server connect");
  }
  else {
    Curl_infof(data,"There is negative response in cache while serv connect\n");
    Curl_GetFTPResponse(&nread,conn,&ftpcode);
  }
  return CURLE_FTP_ACCEPT_FAILED;
}

Assistant:

static CURLcode ReceivedServerConnect(struct connectdata *conn, bool *received)
{
  struct Curl_easy *data = conn->data;
  curl_socket_t ctrl_sock = conn->sock[FIRSTSOCKET];
  curl_socket_t data_sock = conn->sock[SECONDARYSOCKET];
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  int result;
  time_t timeout_ms;
  ssize_t nread;
  int ftpcode;

  *received = FALSE;

  timeout_ms = ftp_timeleft_accept(data);
  infof(data, "Checking for server connect\n");
  if(timeout_ms < 0) {
    /* if a timeout was already reached, bail out */
    failf(data, "Accept timeout occurred while waiting server connect");
    return CURLE_FTP_ACCEPT_TIMEOUT;
  }

  /* First check whether there is a cached response from server */
  if(pp->cache_size && pp->cache && pp->cache[0] > '3') {
    /* Data connection could not be established, let's return */
    infof(data, "There is negative response in cache while serv connect\n");
    Curl_GetFTPResponse(&nread, conn, &ftpcode);
    return CURLE_FTP_ACCEPT_FAILED;
  }

  result = Curl_socket_check(ctrl_sock, data_sock, CURL_SOCKET_BAD, 0);

  /* see if the connection request is already here */
  switch(result) {
  case -1: /* error */
    /* let's die here */
    failf(data, "Error while waiting for server connect");
    return CURLE_FTP_ACCEPT_FAILED;
  case 0:  /* Server connect is not received yet */
    break; /* loop */
  default:

    if(result & CURL_CSELECT_IN2) {
      infof(data, "Ready to accept data connection from server\n");
      *received = TRUE;
    }
    else if(result & CURL_CSELECT_IN) {
      infof(data, "Ctrl conn has data while waiting for data conn\n");
      Curl_GetFTPResponse(&nread, conn, &ftpcode);

      if(ftpcode/100 > 3)
        return CURLE_FTP_ACCEPT_FAILED;

      return CURLE_WEIRD_SERVER_REPLY;
    }

    break;
  } /* switch() */

  return CURLE_OK;
}